

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O0

string * __thiscall Game::CurrentPlayerName_abi_cxx11_(string *__return_storage_ptr__,Game *this)

{
  Player PVar1;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  Game *local_18;
  Game *this_local;
  
  local_18 = this;
  this_local = (Game *)__return_storage_ptr__;
  if (this->m_currentPlayer == None) {
    __assert_fail("m_currentPlayer != Player::None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AntoineJT[P]cpp-things/tictactoe.cpp"
                  ,0x8b,"std::string Game::CurrentPlayerName() const");
  }
  PVar1 = this->m_currentPlayer;
  if (PVar1 != None) {
    if (PVar1 == Circle) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Circle",&local_1a);
      std::allocator<char>::~allocator(&local_1a);
      return __return_storage_ptr__;
    }
    if (PVar1 == Cross) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Cross",&local_19);
      std::allocator<char>::~allocator(&local_19);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Invalid",&local_1b);
  std::allocator<char>::~allocator(&local_1b);
  return __return_storage_ptr__;
}

Assistant:

std::string CurrentPlayerName() const noexcept {
            assert(m_currentPlayer != Player::None);

            switch (m_currentPlayer) {
                case Player::Cross: return "Cross";
                case Player::Circle: return "Circle";
                case Player::None:
                default:
                    return "Invalid";
            }
        }